

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O3

int64_t file_skip(archive_conflict *a,void *client_data,int64_t request)

{
  int error_number;
  __off_t _Var1;
  __off_t _Var2;
  int *piVar3;
  char *fmt;
  read_file_data *mine;
  
  if (*(char *)((long)client_data + 0x1c) == '\0') {
    return 0;
  }
  _Var1 = lseek(*client_data,0,1);
  if ((-1 < _Var1) && (_Var2 = lseek(*client_data,request,1), -1 < _Var2)) {
    return _Var2 - _Var1;
  }
  *(undefined1 *)((long)client_data + 0x1c) = 0;
  piVar3 = __errno_location();
  error_number = *piVar3;
  if (error_number == 0x1d) {
    return 0;
  }
  if (*(int *)((long)client_data + 0x20) == 1) {
    fmt = "Error seeking in \'%s\'";
  }
  else {
    if (*(int *)((long)client_data + 0x20) == 0) {
      archive_set_error((archive *)a,error_number,"Error seeking in stdin");
      return -1;
    }
    fmt = "Error seeking in \'%ls\'";
  }
  archive_set_error((archive *)a,error_number,fmt,(long)client_data + 0x24);
  return -1;
}

Assistant:

static int64_t
file_skip(struct archive *a, void *data, int64_t request)
{
  struct mydata *mydata = (struct mydata *)data;
  int64_t result = lseek(mydata->fd, SEEK_CUR, request);
  if (result >= 0)
    return result;
  archive_set_error(a, errno, "Error seeking in '%s'", mydata->filename);
  return -1;
}